

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O2

void secp256k1_scratch_apply_checkpoint
               (secp256k1_callback *error_callback,secp256k1_scratch *scratch,size_t checkpoint)

{
  int iVar1;
  _func_void_char_ptr_void_ptr *UNRECOVERED_JUMPTABLE;
  void *pvVar2;
  char *pcVar3;
  
  iVar1 = secp256k1_memcmp_var(scratch,"scratch",8);
  if (iVar1 == 0) {
    if (checkpoint <= scratch->alloc_size) {
      scratch->alloc_size = checkpoint;
      return;
    }
    UNRECOVERED_JUMPTABLE = error_callback->fn;
    pvVar2 = error_callback->data;
    pcVar3 = "invalid checkpoint";
  }
  else {
    UNRECOVERED_JUMPTABLE = error_callback->fn;
    pvVar2 = error_callback->data;
    pcVar3 = "invalid scratch space";
  }
  (*UNRECOVERED_JUMPTABLE)(pcVar3,pvVar2);
  return;
}

Assistant:

static void secp256k1_scratch_apply_checkpoint(const secp256k1_callback* error_callback, secp256k1_scratch* scratch, size_t checkpoint) {
    if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
        secp256k1_callback_call(error_callback, "invalid scratch space");
        return;
    }
    if (checkpoint > scratch->alloc_size) {
        secp256k1_callback_call(error_callback, "invalid checkpoint");
        return;
    }
    scratch->alloc_size = checkpoint;
}